

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_extpubkey.cpp
# Opt level: O0

void __thiscall ExtPubkey_DerivePubTweakTest_Test::TestBody(ExtPubkey_DerivePubTweakTest_Test *this)

{
  allocator<unsigned_int> *this_00;
  initializer_list<unsigned_int> __l;
  bool bVar1;
  char *pcVar2;
  AssertHelper local_1b0;
  Message local_1a8;
  string local_1a0;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  Message local_168 [2];
  ByteData256 local_158;
  undefined1 local_140 [8];
  ByteData256 tweak_sum;
  uint local_120 [2];
  iterator local_118;
  size_type local_110;
  undefined1 local_108 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> key_paths;
  undefined1 local_d8 [8];
  ExtPubkey extkey;
  allocator local_31;
  undefined1 local_30 [8];
  string ext_serial;
  ExtPubkey_DerivePubTweakTest_Test *this_local;
  
  ext_serial.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_30,
             "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  cfd::core::ByteData::ByteData
            ((ByteData *)
             &key_paths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(string *)local_30);
  cfd::core::ExtPubkey::ExtPubkey
            ((ExtPubkey *)local_d8,
             (ByteData *)
             &key_paths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::~ByteData
            ((ByteData *)
             &key_paths.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  local_120[0] = 0;
  local_120[1] = 5;
  local_118 = local_120;
  local_110 = 2;
  this_00 = (allocator<unsigned_int> *)
            ((long)&tweak_sum.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  std::allocator<unsigned_int>::allocator(this_00);
  __l._M_len = local_110;
  __l._M_array = local_118;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108,__l,this_00);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&tweak_sum.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  cfd::core::ByteData256::ByteData256((ByteData256 *)local_140);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ExtPubkey::DerivePubTweak
                (&local_158,(ExtPubkey *)local_d8,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
      cfd::core::ByteData256::operator=((ByteData256 *)local_140,&local_158);
      cfd::core::ByteData256::~ByteData256(&local_158);
    }
  }
  else {
    testing::Message::Message(local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xbc,
               "Expected: (tweak_sum = extkey.DerivePubTweak(key_paths)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_168);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_168);
  }
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_1a0,(ByteData256 *)local_140);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_180,
             "\"2f0b491d070c810a9779a8398063ba6e20302604dc36cf6bf6f935e34c68fa22\"",
             "tweak_sum.GetHex().c_str()",
             "2f0b491d070c810a9779a8398063ba6e20302604dc36cf6bf6f935e34c68fa22",pcVar2);
  std::__cxx11::string::~string((string *)&local_1a0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_1a8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_1b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_extpubkey.cpp"
               ,0xbe,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1b0,&local_1a8);
    testing::internal::AssertHelper::~AssertHelper(&local_1b0);
    testing::Message::~Message(&local_1a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  cfd::core::ByteData256::~ByteData256((ByteData256 *)local_140);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_108);
  cfd::core::ExtPubkey::~ExtPubkey((ExtPubkey *)local_d8);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(ExtPubkey, DerivePubTweakTest) {
  std::string ext_serial = "043587cf02f4a831a200000000bdc76da475a6fbdc4f3758939ab2096d4ab53b7d66c0eed66fc0f4be242835fc030061b08c4c80dc04aaa0b44018d2c4bcdb0d9c0992fb4fddf9d2fb096a5164c0";
  ExtPubkey extkey = ExtPubkey(ByteData(ext_serial));

  std::vector<uint32_t> key_paths = {0, 5};
  ByteData256 tweak_sum;
  EXPECT_NO_THROW((tweak_sum = extkey.DerivePubTweak(key_paths)));
#ifndef CFD_DISABLE_ELEMENTS
  EXPECT_STREQ("2f0b491d070c810a9779a8398063ba6e20302604dc36cf6bf6f935e34c68fa22", tweak_sum.GetHex().c_str());
#endif  // CFD_DISABLE_ELEMENTS
}